

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::PlasticMaterial::writeTo(PlasticMaterial *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  BinaryWriter *in_stack_ffffffffffffff18;
  BinaryWriter *in_stack_ffffffffffffff20;
  SP *in_stack_ffffffffffffff50;
  BinaryWriter *entity;
  BinaryWriter *in_stack_ffffffffffffff58;
  BinaryWriter *this_00;
  int32_t local_38;
  int32_t local_14;
  BinaryWriter *local_10;
  
  local_10 = in_RSI;
  Material::writeTo((Material *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff20,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff18);
  local_14 = BinaryWriter::serialize(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  BinaryWriter::write<int>(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x12507a);
  this_00 = (BinaryWriter *)&stack0xffffffffffffffb8;
  entity = local_10;
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff20,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff18);
  local_38 = BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x1250e3);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_ffffffffffffff20,(vec3f *)in_stack_ffffffffffffff18);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_ffffffffffffff20,(vec3f *)in_stack_ffffffffffffff18);
  BinaryWriter::write<float>(in_stack_ffffffffffffff20,(float *)in_stack_ffffffffffffff18);
  BinaryWriter::write<bool>(in_stack_ffffffffffffff20,(bool *)in_stack_ffffffffffffff18);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff20,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff18);
  BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x1251ad);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)local_10,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff18);
  BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(local_10,(int *)in_stack_ffffffffffffff18);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x125210);
  return 0x15;
}

Assistant:

int PlasticMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(map_kd));
    binary.write(binary.serialize(map_ks));
    binary.write(kd);
    binary.write(ks);
    binary.write(roughness);
    binary.write(remapRoughness);
    binary.write(binary.serialize(map_roughness));
    binary.write(binary.serialize(map_bump));
    return TYPE_PLASTIC_MATERIAL;
  }